

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

Vec_Int_t * Gia_RsbCiTranslate(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Lit;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  p_00 = Vec_IntAlloc(100);
  if (vMap->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vMap) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x29d,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar5 = 0;
  Vec_IntPushTwo(p_00,0,0);
  do {
    iVar1 = vObjs->nSize;
    if (iVar1 <= iVar5) {
      for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
        iVar1 = Vec_IntEntry(vObjs,iVar5);
        iVar2 = Gia_WinNodeHasUnmarkedFanouts(p,iVar1);
        if (iVar2 != 0) {
          iVar2 = Vec_IntEntry(vMap,iVar1);
          iVar1 = Vec_IntEntry(vMap,iVar1);
          Vec_IntPushTwo(p_00,iVar2,iVar1);
        }
        iVar1 = vObjs->nSize;
      }
      return p_00;
    }
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar1);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x2a2,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar2 = 0;
    if (((uint)*(undefined8 *)pGVar4 & 0x9fffffff) == 0x9fffffff) {
LAB_0062221e:
      iVar3 = 0;
    }
    else {
      iVar3 = Vec_IntEntry(vMap,iVar1 - ((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      if (((uint)*(undefined8 *)pGVar4 & 0x9fffffff) == 0x9fffffff) goto LAB_0062221e;
      Lit = Vec_IntEntry(vMap,iVar1 - ((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff));
      if (((uint)*(undefined8 *)pGVar4 & 0x9fffffff) == 0x9fffffff) goto LAB_0062221e;
      iVar3 = Abc_LitNotCond(iVar3,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1);
      if (((uint)*(undefined8 *)pGVar4 & 0x9fffffff) != 0x9fffffff) {
        iVar2 = Abc_LitNotCond(Lit,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1);
      }
    }
    Vec_IntWriteEntry(vMap,iVar1,p_00->nSize);
    Vec_IntPushTwo(p_00,iVar3,iVar2);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_RsbCiTranslate( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Int_t * vMap )
{
    int i, iObj, Lit0, Lit1, Fan0, Fan1;
    Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
    assert( Vec_IntSize(vMap) == Gia_ManObjNum(p) );
    Vec_IntPushTwo( vNodes, 0, 0 ); // const0 node
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Fan0 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId0(pObj, iObj));
        Fan1 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId1(pObj, iObj));
        Lit0 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan0, Gia_ObjFaninC0(pObj) );
        Lit1 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan1, Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, iObj, Vec_IntSize(vNodes) );
        Vec_IntPushTwo( vNodes, Lit0, Lit1 );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( Gia_WinNodeHasUnmarkedFanouts( p, iObj ) )
            Vec_IntPushTwo( vNodes, Vec_IntEntry(vMap, iObj), Vec_IntEntry(vMap, iObj) );
    return vNodes;
}